

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

times * __thiscall lest::times::operator()(times *this,test *testing)

{
  _func_void_env_ptr *p_Var1;
  _Setw _Var2;
  env *peVar3;
  ostream *poVar4;
  double dVar5;
  message *anon_var_0;
  text local_40;
  timer local_20;
  timer t;
  test *testing_local;
  times *this_local;
  
  t.start_ticks = (uint64_t)testing;
  timer::timer(&local_20);
  p_Var1 = testing->behaviour;
  std::__cxx11::string::string((string *)&local_40,&testing->name);
  peVar3 = env::operator()(&this->output,&local_40);
  (*p_Var1)(peVar3);
  std::__cxx11::string::~string((string *)&local_40);
  poVar4 = (this->super_action).os;
  _Var2 = std::setw(5);
  poVar4 = std::operator<<(poVar4,_Var2);
  dVar5 = timer::elapsed_seconds(&local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5 * 1000.0);
  poVar4 = std::operator<<(poVar4," ms: ");
  poVar4 = std::operator<<(poVar4,(string *)testing);
  std::operator<<(poVar4,"\n");
  return this;
}

Assistant:

times & operator()( test testing )
    {
        timer t;

        try
        {
            testing.behaviour( output( testing.name ) );
        }
        catch( message const & )
        {
            ++failures;
        }

        os << std::setw(5) << ( 1000 * t.elapsed_seconds() ) << " ms: " << testing.name  << "\n";

        return *this;
    }